

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

quicly_stream_t *
open_stream(quicly_conn_t *conn,uint64_t stream_id,uint32_t initial_max_stream_data_local,
           uint64_t initial_max_stream_data_remote)

{
  undefined1 *puVar1;
  anon_struct_32_2_6d702f80_for_pending_link *paVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  kh_quicly_stream_t_t *h;
  khint32_t *pkVar5;
  ulong uVar6;
  quicly_context_t *pqVar7;
  khint_t kVar8;
  int iVar9;
  khint_t kVar10;
  uint32_t uVar11;
  quicly_stream_t *pqVar12;
  quicly_linklist_t *pqVar13;
  byte bVar14;
  uint uVar15;
  khint_t kVar16;
  khint_t kVar17;
  uint uVar18;
  uint uVar19;
  
  pqVar12 = (quicly_stream_t *)malloc(0x128);
  if (pqVar12 == (quicly_stream_t *)0x0) {
    return (quicly_stream_t *)0x0;
  }
  pqVar12->conn = conn;
  pqVar12->stream_id = stream_id;
  pqVar12->callbacks = (quicly_stream_callbacks_t *)0x0;
  pqVar12->data = (void *)0x0;
  h = conn->streams;
  if (h->upper_bound <= h->n_occupied) {
    uVar18 = h->n_buckets;
    if (h->size * 2 < uVar18) {
      kVar16 = uVar18 - 1;
    }
    else {
      kVar16 = uVar18 + 1;
    }
    iVar9 = kh_resize_quicly_stream_t(h,kVar16);
    if (iVar9 < 0) {
      kVar10 = h->n_buckets;
      goto LAB_00121428;
    }
  }
  kVar16 = h->n_buckets;
  kVar10 = ((uint)(stream_id >> 0x21) ^ (uint)stream_id << 0xb ^ (uint)stream_id) & kVar16 - 1;
  pkVar5 = h->flags;
  if ((pkVar5[kVar10 >> 4] >> ((char)kVar10 * '\x02' & 0x1fU) & 2) == 0) {
    iVar9 = 1;
    uVar18 = kVar10;
    kVar17 = kVar16;
    do {
      uVar15 = uVar18 * 2 & 0x1e;
      uVar19 = pkVar5[uVar18 >> 4] >> (sbyte)uVar15;
      kVar8 = kVar16;
      if (((uVar19 & 2) != 0) || (((uVar19 & 1) == 0 && (h->keys[uVar18] == stream_id)))) break;
      if ((pkVar5[uVar18 >> 4] >> uVar15 & 1) != 0) {
        kVar17 = uVar18;
      }
      uVar18 = uVar18 + iVar9 & kVar16 - 1;
      iVar9 = iVar9 + 1;
      kVar8 = kVar17;
    } while (uVar18 != kVar10);
    kVar10 = kVar8;
    if (kVar8 == kVar16) {
      if (kVar17 == kVar16) {
        kVar17 = uVar18;
      }
      kVar10 = kVar17;
      if ((pkVar5[uVar18 >> 4] >> ((char)uVar18 * '\x02' & 0x1fU) & 2) == 0) {
        kVar10 = uVar18;
      }
    }
  }
  uVar15 = kVar10 >> 4;
  uVar18 = pkVar5[uVar15];
  bVar14 = (char)kVar10 * '\x02' & 0x1e;
  if ((uVar18 >> bVar14 & 2) == 0) {
    if ((uVar18 >> bVar14 & 1) != 0) {
      h->keys[kVar10] = stream_id;
      pkVar5[uVar15] = uVar18 & ~(3 << bVar14);
      h->size = h->size + 1;
    }
  }
  else {
    h->keys[kVar10] = stream_id;
    pkVar5[uVar15] = uVar18 & ~(3 << bVar14);
    uVar3 = h->size;
    uVar4 = h->n_occupied;
    h->size = uVar3 + 1;
    h->n_occupied = uVar4 + 1;
  }
LAB_00121428:
  if (kVar10 != conn->streams->n_buckets) {
    conn->streams->vals[kVar10] = pqVar12;
    uVar6 = pqVar12->stream_id;
    uVar18 = ~(uint)(pqVar12->conn->super).local.bidi.next_stream_id & 1;
    if (((((uint)uVar6 & 1) == uVar18) && (-1 < (long)uVar6)) && ((uVar6 & 2) != 0)) {
      quicly_sendstate_init_closed(&pqVar12->sendstate);
    }
    else {
      quicly_sendstate_init(&pqVar12->sendstate);
    }
    uVar6 = pqVar12->stream_id;
    if (((((uint)uVar6 & 1) == uVar18) || ((long)uVar6 < 0)) || ((uVar6 & 2) == 0)) {
      quicly_recvstate_init(&pqVar12->recvstate);
    }
    else {
      quicly_recvstate_init_closed(&pqVar12->recvstate);
    }
    pqVar12->field_0xb8 = pqVar12->field_0xb8 & 0xfe;
    (pqVar12->_send_aux).max_stream_data = initial_max_stream_data_remote;
    (pqVar12->_send_aux).stop_sending.sender_state = QUICLY_SENDER_STATE_NONE;
    (pqVar12->_send_aux).stop_sending.error_code = 0;
    (pqVar12->_send_aux).reset_stream.sender_state = QUICLY_SENDER_STATE_NONE;
    (pqVar12->_send_aux).reset_stream.error_code = 0;
    (pqVar12->_send_aux).max_stream_data_sender.max_committed = (ulong)initial_max_stream_data_local
    ;
    (pqVar12->_send_aux).max_stream_data_sender.max_acked = (ulong)initial_max_stream_data_local;
    (pqVar12->_send_aux).max_stream_data_sender.num_inflight = 0;
    puVar1 = &(pqVar12->_send_aux).max_stream_data_sender.field_0x18;
    *puVar1 = *puVar1 & 0xfe;
    (pqVar12->_send_aux).blocked = QUICLY_SENDER_STATE_NONE;
    paVar2 = &(pqVar12->_send_aux).pending_link;
    (pqVar12->_send_aux).pending_link.control.next = &paVar2->control;
    (pqVar12->_send_aux).pending_link.control.prev = &paVar2->control;
    pqVar13 = &(pqVar12->_send_aux).pending_link.default_scheduler;
    (pqVar12->_send_aux).pending_link.default_scheduler.next = pqVar13;
    (pqVar12->_send_aux).pending_link.default_scheduler.prev = pqVar13;
    (pqVar12->_recv_aux).window = initial_max_stream_data_local;
    pqVar7 = (pqVar12->conn->super).ctx;
    uVar15 = (int)(pqVar7->transport_params).max_streams_bidi +
             (int)(pqVar7->transport_params).max_streams_uni;
    uVar18 = initial_max_stream_data_local >> 10;
    if (initial_max_stream_data_local >> 10 < uVar15) {
      uVar18 = uVar15;
    }
    uVar11 = 0x3f;
    if (0x3f < uVar18) {
      uVar11 = uVar18;
    }
    (pqVar12->_recv_aux).max_ranges = uVar11;
    return pqVar12;
  }
  __assert_fail("iter != kh_end(conn->streams)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0x42b,"quicly_stream_t *open_stream(quicly_conn_t *, uint64_t, uint32_t, uint64_t)"
               );
}

Assistant:

static quicly_stream_t *open_stream(quicly_conn_t *conn, uint64_t stream_id, uint32_t initial_max_stream_data_local,
                                    uint64_t initial_max_stream_data_remote)
{
    quicly_stream_t *stream;

    if ((stream = malloc(sizeof(*stream))) == NULL)
        return NULL;
    stream->conn = conn;
    stream->stream_id = stream_id;
    stream->callbacks = NULL;
    stream->data = NULL;

    int r;
    khiter_t iter = kh_put(quicly_stream_t, conn->streams, stream_id, &r);
    assert(iter != kh_end(conn->streams));
    kh_val(conn->streams, iter) = stream;

    init_stream_properties(stream, initial_max_stream_data_local, initial_max_stream_data_remote);

    return stream;
}